

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json_test.cpp
# Opt level: O0

void __thiscall
PersistentStorageJsonTestSuite_GetNetworkNotEmpty_Test::
PersistentStorageJsonTestSuite_GetNetworkNotEmpty_Test
          (PersistentStorageJsonTestSuite_GetNetworkNotEmpty_Test *this)

{
  PersistentStorageJsonTestSuite_GetNetworkNotEmpty_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__PersistentStorageJsonTestSuite_GetNetworkNotEmpty_Test_0047f2f0;
  return;
}

Assistant:

TEST(PersistentStorageJsonTestSuite, GetNetworkNotEmpty)
{
    PersistentStorageJson psj("./tmp/test.tmp");

    EXPECT_TRUE(psj.Open() == PersistentStorage::Status::kSuccess);

    NetworkId newId;

    EXPECT_TRUE(psj.Add(Network{EMPTY_ID, EMPTY_ID, "nwk1", 0xFFFFFFFFFFFFFFF1, 11, 0xFFF1, "2000:aaa1::0/8", 1},
                        newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 0);
    EXPECT_TRUE(psj.Add(Network{EMPTY_ID, EMPTY_ID, "nwk2", 0xFFFFFFFFFFFFFFF2, 12, 0xFFF2, "2000:aaa2::0/8", 1},
                        newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 1);
    EXPECT_TRUE(psj.Add(Network{EMPTY_ID, EMPTY_ID, "nwk3", 0xFFFFFFFFFFFFFFF3, 13, 0xFFF3, "2000:aaa3::0/8", 1},
                        newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 2);

    Network returnValue;

    EXPECT_TRUE(psj.Get(NetworkId(5), returnValue) == PersistentStorage::Status::kNotFound);
    EXPECT_TRUE(psj.Get(NetworkId(0), returnValue) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(returnValue.mId.mId == 0);
    EXPECT_TRUE(returnValue.mName == "nwk1");
    EXPECT_TRUE(returnValue.mChannel == 11);

    EXPECT_TRUE(psj.Close() == PersistentStorage::Status::kSuccess);
}